

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_move_32_al_di(void)

{
  uint value;
  uint addr_in;
  uint addr_in_00;
  
  value = OPER_AY_DI_32();
  my_fc_handler(m68ki_cpu.s_flag | 2);
  addr_in_00 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in_00 = pmmu_translate_addr(addr_in_00);
  }
  addr_in = m68k_read_memory_32(addr_in_00 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_32(addr_in & m68ki_cpu.address_mask,value);
  m68ki_cpu.n_flag = value >> 0x18;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_32_al_di(void)
{
	uint res = OPER_AY_DI_32();
	uint ea = EA_AL_32();

	m68ki_write_32(ea, res);

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}